

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O3

void __thiscall
QAbstractScrollArea::setHorizontalScrollBarPolicy(QAbstractScrollArea *this,ScrollBarPolicy policy)

{
  ScrollBarPolicy SVar1;
  QAbstractScrollAreaPrivate *this_00;
  
  this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
  SVar1 = this_00->hbarpolicy;
  this_00->hbarpolicy = policy;
  if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
    QAbstractScrollAreaPrivate::layoutChildren(this_00);
    policy = this_00->hbarpolicy;
  }
  if (SVar1 == policy) {
    return;
  }
  (**(code **)(*(long *)&(this_00->super_QFramePrivate).super_QWidgetPrivate + 0xa8))(this_00,1);
  return;
}

Assistant:

void QAbstractScrollArea::setHorizontalScrollBarPolicy(Qt::ScrollBarPolicy policy)
{
    Q_D(QAbstractScrollArea);
    const Qt::ScrollBarPolicy oldPolicy = d->hbarpolicy;
    d->hbarpolicy = policy;
    if (isVisible())
        d->layoutChildren();
    if (oldPolicy != d->hbarpolicy)
        d->scrollBarPolicyChanged(Qt::Horizontal, d->hbarpolicy);
}